

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
header_inclusion_csv_actions::header(header_inclusion_csv_actions *this,string *header)

{
  if (this->first_header == true) {
    this->first_header = false;
  }
  else {
    std::operator<<((ostream *)&std::cout,' ');
  }
  std::operator<<((ostream *)&std::cout,(string *)header);
  return;
}

Assistant:

void header( std::string const & header )
    {
        if( first_header )
        {
            first_header = false;
        }
        else
        {
            std::cout << ' ';
        }
       
        std::cout << header;
    }